

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SupportVectorClassifier::set_allocated_sparsesupportvectors
          (SupportVectorClassifier *this,SparseSupportVectors *sparsesupportvectors)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_supportVectors(this);
  if (sparsesupportvectors != (SparseSupportVectors *)0x0) {
    submessage_arena =
         google::protobuf::internal::InternalMetadata::owning_arena
                   (&(sparsesupportvectors->super_MessageLite)._internal_metadata_);
    if (message_arena != submessage_arena) {
      sparsesupportvectors =
           (SparseSupportVectors *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&sparsesupportvectors->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 3;
    (this->supportVectors_).sparsesupportvectors_ = sparsesupportvectors;
  }
  return;
}

Assistant:

void SupportVectorClassifier::set_allocated_sparsesupportvectors(::CoreML::Specification::SparseSupportVectors* sparsesupportvectors) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_supportVectors();
  if (sparsesupportvectors) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::SparseSupportVectors>::GetOwningArena(sparsesupportvectors);
    if (message_arena != submessage_arena) {
      sparsesupportvectors = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, sparsesupportvectors, submessage_arena);
    }
    set_has_sparsesupportvectors();
    supportVectors_.sparsesupportvectors_ = sparsesupportvectors;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.SupportVectorClassifier.sparseSupportVectors)
}